

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jit_compiler_x86.cpp
# Opt level: O0

void __thiscall
randomx::JitCompilerX86::generateProgramLight
          (JitCompilerX86 *this,Program *prog,ProgramConfiguration *pcfg,uint32_t datasetOffset)

{
  uint in_ECX;
  Program *in_RDX;
  JitCompilerX86 *in_RSI;
  JitCompilerX86 *in_RDI;
  ProgramConfiguration *unaff_retaddr;
  undefined4 in_stack_00000008;
  undefined4 in_stack_ffffffffffffffe0;
  
  generateProgramPrologue
            ((JitCompilerX86 *)pcfg,(Program *)CONCAT44(datasetOffset,in_stack_00000008),
             unaff_retaddr);
  emit(in_RSI,(uint8_t *)in_RDX,CONCAT44(in_ECX,in_stack_ffffffffffffffe0));
  emit<2ul>((JitCompilerX86 *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),(uint8_t (*) [2])in_RDI);
  emit32(in_RDI,in_ECX >> 6);
  emitByte(in_RDI,0xe8);
  emit32(in_RDI,0x4000 - (in_RDI->codePos + 4));
  emit(in_RSI,(uint8_t *)in_RDX,CONCAT44(in_ECX,in_stack_ffffffffffffffe0));
  generateProgramEpilogue
            (in_RSI,in_RDX,(ProgramConfiguration *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0));
  return;
}

Assistant:

void JitCompilerX86::generateProgramLight(Program& prog, ProgramConfiguration& pcfg, uint32_t datasetOffset) {
		generateProgramPrologue(prog, pcfg);
		emit(codeReadDatasetLightSshInit, readDatasetLightInitSize);
		emit(ADD_EBX_I);
		emit32(datasetOffset / CacheLineSize);
		emitByte(CALL);
		emit32(superScalarHashOffset - (codePos + 4));
		emit(codeReadDatasetLightSshFin, readDatasetLightFinSize);
		generateProgramEpilogue(prog, pcfg);
	}